

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void unroll(lua_State *L,void *ud)

{
  CallInfo *ci;
  ushort uVar1;
  int iVar2;
  StkId oldtop;
  CallInfo *pCVar3;
  uint status;
  
  ci = L->ci;
  while (ci != &L->base_ci) {
    uVar1 = ci->callstatus;
    if ((uVar1 & 2) == 0) {
      luaV_finishOp(L);
      luaV_execute(L,ci);
    }
    else {
      if ((uVar1 >> 9 & 1) == 0) {
        status = 1;
        pCVar3 = ci;
        if ((uVar1 & 0x10) != 0) {
          status = uVar1 >> 10 & 7;
          if ((uVar1 >> 10 & 7) == 0) {
            status = 1;
          }
          else {
            iVar2 = (ci->u2).funcidx;
            L->allowhook = (byte)uVar1 & 1;
            oldtop = luaF_close(L,(StkId)((long)iVar2 + (long)(L->stack).p),status,1);
            luaD_seterrorobj(L,status,oldtop);
            luaD_shrinkstack(L);
            uVar1 = ci->callstatus & 0xe3ff;
            pCVar3 = L->ci;
          }
          ci->callstatus = uVar1 & 0xffef;
          L->errfunc = (ci->u).c.old_errfunc;
        }
        if ((pCVar3->top).p < (L->top).p) {
          (pCVar3->top).p = (L->top).p;
        }
        iVar2 = (*(ci->u).c.k)(L,status,(ci->u).c.ctx);
      }
      else {
        iVar2 = (ci->u2).funcidx;
      }
      luaD_poscall(L,ci,iVar2);
    }
    ci = L->ci;
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  CallInfo *ci;
  UNUSED(ud);
  while ((ci = L->ci) != &L->base_ci) {  /* something in the stack */
    if (!isLua(ci))  /* C function? */
      finishCcall(L, ci);  /* complete its execution */
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L, ci);  /* execute down to higher C 'boundary' */
    }
  }
}